

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_face.c
# Opt level: O0

REF_STATUS ref_face_add_uniquely(REF_FACE ref_face,REF_INT *nodes)

{
  uint uVar1;
  void *pvVar2;
  int local_40;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT chunk;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS status;
  REF_INT node;
  REF_INT face;
  REF_INT *nodes_local;
  REF_FACE ref_face_local;
  
  _node = nodes;
  nodes_local = &ref_face->n;
  uVar1 = ref_face_with(ref_face,nodes,&status);
  if (uVar1 == 0) {
    ref_face_local._4_4_ = 0;
  }
  else if ((uVar1 == 5) || (uVar1 == 0)) {
    if (nodes_local[1] <= *nodes_local) {
      if ((int)((double)nodes_local[1] * 1.5) < 5000) {
        local_40 = 5000;
      }
      else {
        local_40 = (int)((double)nodes_local[1] * 1.5);
      }
      nodes_local[1] = local_40 + nodes_local[1];
      fflush(_stdout);
      if (0 < nodes_local[1] * 4) {
        pvVar2 = realloc(*(void **)(nodes_local + 2),(long)(nodes_local[1] << 2) << 2);
        *(void **)(nodes_local + 2) = pvVar2;
      }
      if (*(long *)(nodes_local + 2) == 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0xbc
               ,"ref_face_add_uniquely","realloc ref_face->f2n NULL");
        printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
               (ulong)(uint)(nodes_local[1] << 2),(long)(nodes_local[1] << 2),4,
               (long)(nodes_local[1] << 2) << 2);
        return 2;
      }
    }
    status = *nodes_local;
    *nodes_local = *nodes_local + 1;
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 4;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      *(REF_INT *)(*(long *)(nodes_local + 2) + (long)(ref_private_macro_code_rss + status * 4) * 4)
           = _node[ref_private_macro_code_rss];
    }
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < 3;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      uVar1 = ref_adj_add(*(REF_ADJ *)(nodes_local + 4),
                          *(REF_INT *)
                           (*(long *)(nodes_local + 2) +
                           (long)(ref_private_macro_code_rss + status * 4) * 4),status);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",200,
               "ref_face_add_uniquely",(ulong)uVar1,"reg face node");
        return uVar1;
      }
    }
    if ((*(int *)(*(long *)(nodes_local + 2) + (long)(status << 2) * 4) ==
         *(int *)(*(long *)(nodes_local + 2) + (long)(status * 4 + 3) * 4)) ||
       (ref_face_local._4_4_ =
             ref_adj_add(*(REF_ADJ *)(nodes_local + 4),
                         *(REF_INT *)(*(long *)(nodes_local + 2) + (long)(status * 4 + 3) * 4),
                         status), ref_face_local._4_4_ == 0)) {
      ref_face_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0xcd,
             "ref_face_add_uniquely",(ulong)ref_face_local._4_4_,"reg face node");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_face.c",0xb6,
           "ref_face_add_uniquely",(ulong)uVar1,"looking for face");
    ref_face_local._4_4_ = uVar1;
  }
  return ref_face_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_face_add_uniquely(REF_FACE ref_face, REF_INT *nodes) {
  REF_INT face, node;
  REF_STATUS status;

  status = ref_face_with(ref_face, nodes, &face);
  if (REF_SUCCESS == status) return REF_SUCCESS;
  if (REF_NOT_FOUND != status) RSS(status, "looking for face");

  if (ref_face_n(ref_face) >= ref_face_max(ref_face)) {
    REF_INT chunk;
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)ref_face_max(ref_face)));
    ref_face_max(ref_face) += chunk;
    ref_realloc(ref_face->f2n, 4 * ref_face_max(ref_face), REF_INT);
  }

  face = ref_face_n(ref_face);
  ref_face_n(ref_face)++;

  for (node = 0; node < 4; node++)
    ref_face_f2n(ref_face, node, face) = nodes[node];

  for (node = 0; node < 3; node++)
    RSS(ref_adj_add(ref_face_adj(ref_face), ref_face_f2n(ref_face, node, face),
                    face),
        "reg face node");

  if (ref_face_f2n(ref_face, 0, face) != ref_face_f2n(ref_face, 3, face))
    RSS(ref_adj_add(ref_face_adj(ref_face), ref_face_f2n(ref_face, 3, face),
                    face),
        "reg face node");

  return REF_SUCCESS;
}